

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O1

PublicationInfo * __thiscall
helics::InterfaceInfo::getPublication(InterfaceInfo *this,string *pubName)

{
  const_iterator cVar1;
  _Head_base<0UL,_helics::PublicationInfo_*,_false> _Var2;
  unique_lock<std::shared_mutex> local_28;
  
  local_28._M_device = &(this->publications).m_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&local_28);
  local_28._M_owns = true;
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->publications).m_obj.lookup1._M_h,pubName);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    _Var2._M_head_impl = (PublicationInfo *)0x0;
  }
  else {
    _Var2._M_head_impl =
         *(PublicationInfo **)
          &(this->publications).m_obj.dataStorage.
           super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [*(long *)((long)cVar1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                            ._M_cur + 0x28)]._M_t;
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_28);
  return (PublicationInfo *)
         (tuple<helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>)
         _Var2._M_head_impl;
}

Assistant:

PublicationInfo* InterfaceInfo::getPublication(const std::string& pubName)
{
    return publications.lock()->find(pubName);
}